

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XUtil.cpp
# Opt level: O0

DOMElement * xercesc_4_0::XUtil::getFirstChildElement(DOMNode *parent)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMElement *local_20;
  DOMNode *child;
  DOMNode *parent_local;
  
  iVar1 = (*parent->_vptr_DOMNode[7])();
  local_20 = (DOMElement *)CONCAT44(extraout_var,iVar1);
  while( true ) {
    if (local_20 == (DOMElement *)0x0) {
      return (DOMElement *)0x0;
    }
    iVar1 = (*(local_20->super_DOMNode)._vptr_DOMNode[4])();
    if (iVar1 == 1) break;
    iVar1 = (*(local_20->super_DOMNode)._vptr_DOMNode[10])();
    local_20 = (DOMElement *)CONCAT44(extraout_var_00,iVar1);
  }
  return local_20;
}

Assistant:

DOMElement* XUtil::getFirstChildElement(const DOMNode* const parent)
{
    // search for node
    DOMNode* child = parent->getFirstChild();

    while (child != 0)
	{
        if (child->getNodeType() == DOMNode::ELEMENT_NODE)
            return (DOMElement*)child;

        child = child->getNextSibling();
    }

    // not found
    return 0;
}